

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O0

int skiwi::is_number(int *is_real,int *is_scientific,char *value)

{
  int iVar1;
  byte *local_38;
  char *s;
  int i;
  char *value_local;
  int *is_scientific_local;
  int *is_real_local;
  
  if (*value == '\0') {
    is_real_local._4_4_ = 0;
  }
  else {
    s._4_4_ = 0;
    if ((*value == 'e') || (*value == 'E')) {
      is_real_local._4_4_ = 0;
    }
    else if (((*value == '-') || (*value == '+')) && (s._4_4_ = 1, value[1] == '\0')) {
      is_real_local._4_4_ = 0;
    }
    else {
      *is_real = 0;
      *is_scientific = 0;
      for (local_38 = (byte *)(value + s._4_4_); *local_38 != 0; local_38 = local_38 + 1) {
        iVar1 = isdigit((uint)*local_38);
        if (iVar1 == 0) {
          if (((*local_38 == 0x2e) && (*is_real == 0)) && (*is_scientific == 0)) {
            *is_real = 1;
          }
          else {
            if (((*local_38 != 0x65) && (*local_38 != 0x45)) || (*is_scientific != 0)) {
              return 0;
            }
            *is_scientific = 1;
            *is_real = 1;
            if (local_38[1] == 0) {
              return 0;
            }
            if ((local_38[1] == 0x2d) || (local_38[1] == 0x2b)) {
              local_38 = local_38 + 1;
            }
            if (local_38[1] == 0) {
              return 0;
            }
          }
        }
      }
      is_real_local._4_4_ = 1;
    }
  }
  return is_real_local._4_4_;
}

Assistant:

int is_number(int* is_real, int* is_scientific, const char* value)
  {
  if (value[0] == '\0')
    return 0;
  int i = 0;
  if (value[0] == 'e' || value[0] == 'E')
    return 0;
  if (value[0] == '-' || value[0] == '+')
    {
    ++i;
    if (value[1] == '\0')
      return 0;
    }
  *is_real = 0;
  *is_scientific = 0;
  const char* s = value + i;
  while (*s != '\0')
    {
    if (isdigit((unsigned char)(*s)) == 0)
      {
      if ((*s == '.') && (*is_real == 0) && (*is_scientific == 0))
        *is_real = 1;
      else if ((*s == 'e' || *s == 'E') && (*is_scientific == 0))
        {
        *is_scientific = 1;
        *is_real = 1;
        if (*(s + 1) == '\0')
          return 0;
        if (*(s + 1) == '-' || *(s + 1) == '+')
          {
          ++s;
          }
        if (*(s + 1) == '\0')
          return 0;
        }
      else
        return 0;
      }
    ++s;
    }
  return 1;
  }